

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::~ArrayBuilder
          (ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *this)

{
  Dependency *pDVar1;
  RemoveConst<capnp::_::RawBrandedSchema::Dependency> *pRVar2;
  Dependency *pDVar3;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (Dependency *)0x0) {
    pRVar2 = this->pos;
    pDVar3 = this->endPtr;
    this->ptr = (Dependency *)0x0;
    this->pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)0x0;
    this->endPtr = (Dependency *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pDVar1,0x10,(long)pRVar2 - (long)pDVar1 >> 4,
               (long)pDVar3 - (long)pDVar1 >> 4,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }